

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::Dump(FunctionBody *dumpFunction)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  OpCode op_00;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  RegSlot RVar8;
  RegSlot RVar9;
  RegSlot RVar10;
  ByteBlock *this;
  undefined4 *puVar11;
  char16_t *local_a0;
  int local_80;
  int i;
  int endByteOffset;
  int layoutStart;
  uint uStack_6c;
  OpCode op;
  LayoutSize layoutSize;
  uint byteOffset;
  uint32 statementIndex;
  ArgSlot paramIndex;
  ArgSlot inParamCount;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  statementReader;
  ByteCodeReader reader;
  FunctionBody *dumpFunction_local;
  
  ByteCodeReader::Create((ByteCodeReader *)&statementReader.m_statementIndex,dumpFunction,0);
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::StatementReader((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                     *)&statementIndex);
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            *)&statementIndex,dumpFunction,0);
  FunctionBody::DumpFullFunctionName(dumpFunction);
  Output::Print(L" (");
  byteOffset._2_2_ =
       ParseableFunctionInfo::GetInParamsCount(&dumpFunction->super_ParseableFunctionInfo);
  for (byteOffset._0_2_ = 0; (ushort)byteOffset < byteOffset._2_2_;
      byteOffset._0_2_ = (ushort)byteOffset + 1) {
    if ((ushort)byteOffset != 0) {
      Output::Print(L", ");
    }
    Output::Print(L"In%hu",(ulong)(ushort)byteOffset);
  }
  Output::Print(L") ");
  uVar6 = FunctionBody::GetByteCodeCount(dumpFunction);
  uVar7 = FunctionBody::GetByteCodeWithoutLDACount(dumpFunction);
  Output::Print(L"(size: %d [%d])\n",(ulong)uVar6,(ulong)uVar7);
  bVar3 = FunctionProxy::IsInDebugMode((FunctionProxy *)dumpFunction);
  if (bVar3) {
    Output::Print(L"[Bytecode was generated for debug mode]\n");
  }
  bVar3 = ParseableFunctionInfo::IsReparsed(&dumpFunction->super_ParseableFunctionInfo);
  if (bVar3) {
    Output::Print(L"[A reparse is being done]\n");
  }
  RVar8 = FunctionBody::GetLocalsCount(dumpFunction);
  RVar9 = FunctionBody::GetTempCount(dumpFunction);
  RVar10 = FunctionBody::GetFirstTmpReg(dumpFunction);
  uVar6 = FunctionBody::GetInlineCacheCount(dumpFunction);
  Output::Print(L"      %u locals (%u temps from R%u), %u inline cache\n",(ulong)RVar8,(ulong)RVar9,
                (ulong)RVar10,(ulong)uVar6);
  layoutSize = SmallLayout;
  DumpConstantTable(dumpFunction);
  DumpImplicitArgIns(dumpFunction);
  while( true ) {
    while (bVar3 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                   ::AtStatementBoundary
                             ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                               *)&statementIndex,(ByteCodeReader *)&statementReader.m_statementIndex
                             ), bVar3) {
      FunctionBody::PrintStatementSourceLine(dumpFunction,layoutSize);
      layoutSize = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                   ::MoveNextStatementBoundary
                             ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                               *)&statementIndex);
    }
    uStack_6c = ByteCodeReader::GetCurrentOffset
                          ((ByteCodeReader *)&statementReader.m_statementIndex);
    op_00 = ByteCodeReader::ReadOp
                      ((ByteCodeReader *)&statementReader.m_statementIndex,
                       (LayoutSize *)&layoutStart);
    if (op_00 == EndOfBlock) break;
    if (layoutStart == 2) {
      local_a0 = L"L-";
    }
    else {
      local_a0 = L"";
      if (layoutStart == 1) {
        local_a0 = L"M-";
      }
    }
    Output::Print(L"    %04x %2s",(ulong)uStack_6c,local_a0);
    DumpOp(op_00,layoutStart,(ByteCodeReader *)&statementReader.m_statementIndex,dumpFunction);
    uVar2 = uStack_6c;
    if ((DAT_01ec73ca & 1) != 0) {
      i = uStack_6c + 2;
      uVar6 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)&statementReader.m_statementIndex);
      Output::SkipToColumn(0x46);
      if (layoutStart == 2) {
        uVar5 = 4;
        if (MaxByteSizedOpcodes < op_00) {
          uVar5 = 5;
        }
        Output::Print(L"%02X ",(ulong)uVar5);
      }
      else if (layoutStart == 1) {
        uVar5 = 2;
        if (MaxByteSizedOpcodes < op_00) {
          uVar5 = 3;
        }
        Output::Print(L"%02X ",(ulong)uVar5);
      }
      else {
        if (layoutStart != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                      ,0x6a,"(layoutSize == SmallLayout)",
                                      "layoutSize == SmallLayout");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        if (op_00 < InvalidOpCode) {
          Output::Print(L"   ");
          i = uVar2 + 1;
        }
        else {
          Output::Print(L"%02X ",1);
        }
      }
      Output::Print(L"%02x",(ulong)(byte)op_00);
      for (local_80 = i; local_80 < (int)uVar6; local_80 = local_80 + 1) {
        bVar4 = ByteCodeReader::GetRawByte
                          ((ByteCodeReader *)&statementReader.m_statementIndex,local_80);
        Output::Print(L" %02x",(ulong)bVar4);
      }
    }
    Output::Print(L"\n");
  }
  uVar6 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)&statementReader.m_statementIndex);
  this = FunctionBody::GetByteCode(dumpFunction);
  uVar7 = ByteBlock::GetLength(this);
  if (uVar6 != uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x52,
                                "(reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength())"
                                ,
                                "reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar3 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          ::AtStatementBoundary
                    ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                      *)&statementIndex,(ByteCodeReader *)&statementReader.m_statementIndex);
  if (bVar3) {
    FunctionBody::PrintStatementSourceLine(dumpFunction,layoutSize);
    layoutSize = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                 ::MoveNextStatementBoundary
                           ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                             *)&statementIndex);
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void ByteCodeDumper::Dump(FunctionBody* dumpFunction)
    {
        ByteCodeReader reader;
        reader.Create(dumpFunction);
        StatementReader<FunctionBody::StatementMapList> statementReader;
        statementReader.Create(dumpFunction);
        dumpFunction->DumpFullFunctionName();
        Output::Print(_u(" ("));
        ArgSlot inParamCount = dumpFunction->GetInParamsCount();
        for (ArgSlot paramIndex = 0; paramIndex < inParamCount; paramIndex++)
        {
            if (paramIndex > 0)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("In%hu"), paramIndex);
        }
        Output::Print(_u(") "));
        Output::Print(_u("(size: %d [%d])\n"), dumpFunction->GetByteCodeCount(), dumpFunction->GetByteCodeWithoutLDACount());
#if defined(DBG) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        if (dumpFunction->IsInDebugMode())
        {
            Output::Print(_u("[Bytecode was generated for debug mode]\n"));
        }
#endif
#if DBG
        if (dumpFunction->IsReparsed())
        {
            Output::Print(_u("[A reparse is being done]\n"));
        }
#endif
        Output::Print(
            _u("      %u locals (%u temps from R%u), %u inline cache\n"),
            dumpFunction->GetLocalsCount(),
            dumpFunction->GetTempCount(),
            dumpFunction->GetFirstTmpReg(),
            dumpFunction->GetInlineCacheCount());
        uint32 statementIndex = 0;
        ByteCodeDumper::DumpConstantTable(dumpFunction);
        ByteCodeDumper::DumpImplicitArgIns(dumpFunction);
        while (true)
        {
            while (statementReader.AtStatementBoundary(&reader))
            {
                dumpFunction->PrintStatementSourceLine(statementIndex);
                statementIndex = statementReader.MoveNextStatementBoundary();
            }
            uint byteOffset = reader.GetCurrentOffset();
            LayoutSize layoutSize;
            OpCode op = reader.ReadOp(layoutSize);
            if (op == OpCode::EndOfBlock)
            {
                Assert(reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength());
                break;
            }
            Output::Print(_u("    %04x %2s"), byteOffset, layoutSize == LargeLayout? _u("L-") : layoutSize == MediumLayout? _u("M-") : _u(""));
            DumpOp(op, layoutSize, reader, dumpFunction);
            if (Js::Configuration::Global.flags.Verbose)
            {
                int layoutStart = byteOffset + 2; // Account fo the prefix op
                int endByteOffset = reader.GetCurrentOffset();
                Output::SkipToColumn(70);
                if (layoutSize == LargeLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCode::MaxByteSizedOpcodes?
                            Js::OpCode::ExtendedLargeLayoutPrefix : Js::OpCode::LargeLayoutPrefix);
                }
                else if (layoutSize == MediumLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCode::MaxByteSizedOpcodes?
                            Js::OpCode::ExtendedMediumLayoutPrefix : Js::OpCode::MediumLayoutPrefix);
                }
                else
                {
                    Assert(layoutSize == SmallLayout);
                    if (op > Js::OpCode::MaxByteSizedOpcodes)
                    {
                        Output::Print(_u("%02X "), Js::OpCode::ExtendedOpcodePrefix);
                    }
                    else
                    {
                        Output::Print(_u("   "));
                        layoutStart--; // don't have a prefix
                    }
                }

                Output::Print(_u("%02x"), (byte)op);
                for (int i = layoutStart; i < endByteOffset; i++)
                {
                    Output::Print(_u(" %02x"), reader.GetRawByte(i));
                }
            }
            Output::Print(_u("\n"));
        }
        if (statementReader.AtStatementBoundary(&reader))
        {
            dumpFunction->PrintStatementSourceLine(statementIndex);
            statementIndex = statementReader.MoveNextStatementBoundary();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }